

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChPhysicsItem.cpp
# Opt level: O1

shared_ptr<chrono::ChVisualShape> __thiscall
chrono::ChPhysicsItem::GetVisualShape(ChPhysicsItem *this,uint i)

{
  undefined8 *puVar1;
  long *plVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar3;
  pointer pcVar4;
  long lVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined4 in_register_00000034;
  shared_ptr<chrono::ChVisualShape> sVar6;
  
  puVar1 = *(undefined8 **)(CONCAT44(in_register_00000034,i) + 0x40);
  if (puVar1 == (undefined8 *)0x0) {
    (this->super_ChObj)._vptr_ChObj = (_func_int **)0x0;
    (this->super_ChObj).m_name._M_dataplus._M_p = (pointer)0x0;
  }
  else {
    plVar2 = (long *)*puVar1;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar1[1];
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    lVar3 = *plVar2;
    lVar5 = ((ulong)in_RDX._M_pi & 0xffffffff) * 0x98;
    in_RDX._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar3 + lVar5);
    (this->super_ChObj)._vptr_ChObj = (_func_int **)in_RDX._M_pi;
    pcVar4 = *(pointer *)(lVar3 + 8 + lVar5);
    (this->super_ChObj).m_name._M_dataplus._M_p = pcVar4;
    if (pcVar4 != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(pcVar4 + 8) = *(int *)(pcVar4 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(pcVar4 + 8) = *(int *)(pcVar4 + 8) + 1;
      }
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      in_RDX._M_pi = extraout_RDX;
    }
  }
  sVar6.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar6.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chrono::ChVisualShape>)
         sVar6.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ChVisualShape> ChPhysicsItem::GetVisualShape(unsigned int i) const {
    if (!vis_model_instance)
        return nullptr;
    return vis_model_instance->GetModel()->GetShape(i);
}